

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O2

void __thiscall
randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false>::run
          (CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false> *this,void *seed)

{
  VmBase<randomx::AlignedAllocator<64UL>,_true>::generateProgram
            ((VmBase<randomx::AlignedAllocator<64UL>,_true> *)this,seed);
  randomx_vm::initialize((randomx_vm *)this);
  JitCompilerX86::generateProgram
            (&this->compiler,(Program *)&this->field_0x40,(ProgramConfiguration *)&this->field_0x9c0
            );
  *(long *)&this->field_0x9e8 = **(long **)&this->field_0x9f8 + *(long *)&this->field_0xa00;
  (*(code *)(this->compiler).code)
            (&this->field_0x8c0,&this->field_0x9e0,*(undefined8 *)&this->field_0x9f0,0x800);
  return;
}

Assistant:

void CompiledVm<Allocator, softAes, secureJit>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		randomx_vm::initialize();
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateProgram(program, config);
		if (secureJit) {
			compiler.enableExecution();
		}
		mem.memory = datasetPtr->memory + datasetOffset;
		execute();
	}